

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpge.cpp
# Opt level: O0

void __thiscall jpge::jpeg_encoder::code_coefficients_pass_two(jpeg_encoder *this,int component_num)

{
  int iVar1;
  uint8 (*local_58) [256];
  uint8 *code_sizes [2];
  uint *codes [2];
  int16 *pSrc;
  uint local_28;
  int temp2;
  int temp1;
  int nbits;
  int run_len;
  int j;
  int i;
  int component_num_local;
  jpeg_encoder *this_local;
  
  if (component_num == 0) {
    code_sizes[1] = (uint8 *)this->m_huff_codes;
    codes[0] = this->m_huff_codes[2];
    local_58 = this->m_huff_code_sizes;
    code_sizes[0] = this->m_huff_code_sizes[2];
  }
  else {
    code_sizes[1] = (uint8 *)(this->m_huff_codes + 1);
    codes[0] = this->m_huff_codes[3];
    local_58 = this->m_huff_code_sizes + 1;
    code_sizes[0] = this->m_huff_code_sizes[3];
  }
  pSrc._4_4_ = (int)this->m_coefficient_array[0] - this->m_last_dc_val[component_num];
  this->m_last_dc_val[component_num] = (int)this->m_coefficient_array[0];
  local_28 = pSrc._4_4_;
  if ((int)pSrc._4_4_ < 0) {
    local_28 = -pSrc._4_4_;
    pSrc._4_4_ = pSrc._4_4_ - 1;
  }
  temp2 = 0;
  for (; local_28 != 0; local_28 = (int)local_28 >> 1) {
    temp2 = temp2 + 1;
  }
  put_bits(this,*(uint *)(code_sizes[1] + (long)temp2 * 4),(uint)(*local_58)[temp2]);
  if (temp2 != 0) {
    put_bits(this,pSrc._4_4_ & (1 << ((byte)temp2 & 0x1f)) - 1U,temp2);
  }
  temp1 = 0;
  for (run_len = 1; run_len < 0x40; run_len = run_len + 1) {
    pSrc._4_4_ = (uint)this->m_coefficient_array[run_len];
    if (pSrc._4_4_ == 0) {
      temp1 = temp1 + 1;
    }
    else {
      for (; 0xf < temp1; temp1 = temp1 + -0x10) {
        put_bits(this,codes[0][0xf0],(uint)code_sizes[0][0xf0]);
      }
      local_28 = pSrc._4_4_;
      if ((int)pSrc._4_4_ < 0) {
        local_28 = -pSrc._4_4_;
        pSrc._4_4_ = pSrc._4_4_ - 1;
      }
      temp2 = 1;
      while (local_28 = (int)local_28 >> 1, local_28 != 0) {
        temp2 = temp2 + 1;
      }
      iVar1 = temp1 * 0x10 + temp2;
      put_bits(this,codes[0][iVar1],(uint)code_sizes[0][iVar1]);
      put_bits(this,pSrc._4_4_ & (1 << ((byte)temp2 & 0x1f)) - 1U,temp2);
      temp1 = 0;
    }
  }
  if (temp1 != 0) {
    put_bits(this,*codes[0],(uint)*code_sizes[0]);
  }
  return;
}

Assistant:

void jpeg_encoder::code_coefficients_pass_two(int component_num)
{
  int i, j, run_len, nbits, temp1, temp2;
  int16 *pSrc = m_coefficient_array;
  uint *codes[2];
  uint8 *code_sizes[2];

  if (component_num == 0)
  {
    codes[0] = m_huff_codes[0 + 0]; codes[1] = m_huff_codes[2 + 0];
    code_sizes[0] = m_huff_code_sizes[0 + 0]; code_sizes[1] = m_huff_code_sizes[2 + 0];
  }
  else
  {
    codes[0] = m_huff_codes[0 + 1]; codes[1] = m_huff_codes[2 + 1];
    code_sizes[0] = m_huff_code_sizes[0 + 1]; code_sizes[1] = m_huff_code_sizes[2 + 1];
  }

  temp1 = temp2 = pSrc[0] - m_last_dc_val[component_num];
  m_last_dc_val[component_num] = pSrc[0];

  if (temp1 < 0)
  {
    temp1 = -temp1; temp2--;
  }

  nbits = 0;
  while (temp1)
  {
    nbits++; temp1 >>= 1;
  }

  put_bits(codes[0][nbits], code_sizes[0][nbits]);
  if (nbits) put_bits(temp2 & ((1 << nbits) - 1), nbits);

  for (run_len = 0, i = 1; i < 64; i++)
  {
    if ((temp1 = m_coefficient_array[i]) == 0)
      run_len++;
    else
    {
      while (run_len >= 16)
      {
        put_bits(codes[1][0xF0], code_sizes[1][0xF0]);
        run_len -= 16;
      }
      if ((temp2 = temp1) < 0)
      {
        temp1 = -temp1;
        temp2--;
      }
      nbits = 1;
      while (temp1 >>= 1)
        nbits++;
      j = (run_len << 4) + nbits;
      put_bits(codes[1][j], code_sizes[1][j]);
      put_bits(temp2 & ((1 << nbits) - 1), nbits);
      run_len = 0;
    }
  }
  if (run_len)
    put_bits(codes[1][0], code_sizes[1][0]);
}